

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O1

bool __thiscall
VW::config::options_boost_po::add_if_t<std::vector<int,std::allocator<int>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  size_t sVar1;
  element_type *peVar2;
  size_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>_> local_38;
  
  sVar1 = ((opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_type_hash;
  sVar3 = std::type_info::hash_code((type_info *)&std::vector<int,std::allocator<int>>::typeinfo);
  if (sVar1 == sVar3) {
    peVar2 = (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      local_38.
      super___shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
    }
    else {
      local_38.
      super___shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                __dynamic_cast(peVar2,&base_option::typeinfo,
                               &typed_option<std::vector<int,std::allocator<int>>>::typeinfo,0);
    }
    if (local_38.
        super___shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      local_38.
      super___shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_38.
    super___shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
    add_to_description<std::vector<int,std::allocator<int>>>(this,&local_38,options_description);
    if (local_38.
        super___shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.
                 super___shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return sVar1 == sVar3;
}

Assistant:

bool options_boost_po::add_if_t(std::shared_ptr<base_option> opt, po::options_description& options_description)
{
  if (opt->m_type_hash == typeid(T).hash_code())
  {
    auto typed = std::dynamic_pointer_cast<typed_option<T>>(opt);
    add_to_description(typed, options_description);
    return true;
  }

  return false;
}